

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O2

FT_Error ft_stroker_cap(FT_Stroker stroker,FT_Angle angle,FT_Int side)

{
  FT_Pos *vec;
  FT_Stroker_LineCap FVar1;
  FT_Fixed FVar2;
  FT_Error FVar3;
  undefined1 local_58 [8];
  FT_Vector delta2;
  FT_Vector delta;
  
  FVar1 = stroker->line_cap;
  if (FVar1 == FT_STROKER_LINECAP_BUTT) {
    FVar2 = stroker->radius;
    vec = &delta2.y;
    FT_Vector_From_Polar((FT_Vector *)vec,FVar2,angle + 0x5a0000);
    delta2.y = delta2.y + (stroker->center).x;
    FVar3 = ft_stroke_border_lineto(stroker->borders,(FT_Vector *)vec,'\0');
    if (FVar3 != 0) {
      return FVar3;
    }
    FT_Vector_From_Polar((FT_Vector *)vec,FVar2,angle + -0x5a0000);
    delta2.y = delta2.y + (stroker->center).x;
  }
  else {
    if (FVar1 != FT_STROKER_LINECAP_SQUARE) {
      if (FVar1 != FT_STROKER_LINECAP_ROUND) {
        return 0;
      }
      stroker->angle_in = angle;
      stroker->angle_out = angle + 0xb40000;
      FVar3 = ft_stroker_arcto(stroker,0);
      return FVar3;
    }
    FVar2 = stroker->radius;
    FT_Vector_From_Polar((FT_Vector *)local_58,FVar2,angle + 0x5a0000);
    FT_Vector_From_Polar((FT_Vector *)&delta2.y,FVar2,angle);
    delta2.y = delta2.y + (long)local_58 + (stroker->center).x;
    FVar3 = ft_stroke_border_lineto(stroker->borders,(FT_Vector *)&delta2.y,'\0');
    if (FVar3 != 0) {
      return FVar3;
    }
    FT_Vector_From_Polar((FT_Vector *)local_58,FVar2,angle + -0x5a0000);
    FT_Vector_From_Polar((FT_Vector *)&delta2.y,FVar2,angle);
    delta2.y = delta2.y + (stroker->center).x + (long)local_58;
  }
  FVar3 = ft_stroke_border_lineto(stroker->borders,(FT_Vector *)&delta2.y,'\0');
  return FVar3;
}

Assistant:

static FT_Error
  ft_stroker_cap( FT_Stroker  stroker,
                  FT_Angle    angle,
                  FT_Int      side )
  {
    FT_Error  error = FT_Err_Ok;


    if ( stroker->line_cap == FT_STROKER_LINECAP_ROUND )
    {
      /* add a round cap */
      stroker->angle_in  = angle;
      stroker->angle_out = angle + FT_ANGLE_PI;

      error = ft_stroker_arcto( stroker, side );
    }
    else if ( stroker->line_cap == FT_STROKER_LINECAP_SQUARE )
    {
      /* add a square cap */
      FT_Vector        delta, delta2;
      FT_Angle         rotate = FT_SIDE_TO_ROTATE( side );
      FT_Fixed         radius = stroker->radius;
      FT_StrokeBorder  border = stroker->borders + side;


      FT_Vector_From_Polar( &delta2, radius, angle + rotate );
      FT_Vector_From_Polar( &delta,  radius, angle );

      delta.x += stroker->center.x + delta2.x;
      delta.y += stroker->center.y + delta2.y;

      error = ft_stroke_border_lineto( border, &delta, FALSE );
      if ( error )
        goto Exit;

      FT_Vector_From_Polar( &delta2, radius, angle - rotate );
      FT_Vector_From_Polar( &delta,  radius, angle );

      delta.x += delta2.x + stroker->center.x;
      delta.y += delta2.y + stroker->center.y;

      error = ft_stroke_border_lineto( border, &delta, FALSE );
    }
    else if ( stroker->line_cap == FT_STROKER_LINECAP_BUTT )
    {
      /* add a butt ending */
      FT_Vector        delta;
      FT_Angle         rotate = FT_SIDE_TO_ROTATE( side );
      FT_Fixed         radius = stroker->radius;
      FT_StrokeBorder  border = stroker->borders + side;


      FT_Vector_From_Polar( &delta, radius, angle + rotate );

      delta.x += stroker->center.x;
      delta.y += stroker->center.y;

      error = ft_stroke_border_lineto( border, &delta, FALSE );
      if ( error )
        goto Exit;

      FT_Vector_From_Polar( &delta, radius, angle - rotate );

      delta.x += stroker->center.x;
      delta.y += stroker->center.y;

      error = ft_stroke_border_lineto( border, &delta, FALSE );
    }

  Exit:
    return error;
  }